

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O0

int Curl_SOCKS_getsock(connectdata *conn,curl_socket_t *sock,int sockindex)

{
  connect_t cVar1;
  int local_20;
  int rc;
  int sockindex_local;
  curl_socket_t *sock_local;
  connectdata *conn_local;
  
  *sock = conn->sock[sockindex];
  cVar1 = (conn->cnnct).state;
  if ((((cVar1 == CONNECT_SOCKS_READ) || (cVar1 == CONNECT_AUTH_READ)) ||
      (cVar1 == CONNECT_RESOLVING)) || (cVar1 == CONNECT_REQ_READ || cVar1 == CONNECT_REQ_READ_MORE)
     ) {
    local_20 = 1;
  }
  else {
    local_20 = 0x10000;
  }
  return local_20;
}

Assistant:

int Curl_SOCKS_getsock(struct connectdata *conn, curl_socket_t *sock,
                       int sockindex)
{
  int rc = 0;
  sock[0] = conn->sock[sockindex];
  switch(conn->cnnct.state) {
  case CONNECT_RESOLVING:
  case CONNECT_SOCKS_READ:
  case CONNECT_AUTH_READ:
  case CONNECT_REQ_READ:
  case CONNECT_REQ_READ_MORE:
    rc = GETSOCK_READSOCK(0);
    break;
  default:
    rc = GETSOCK_WRITESOCK(0);
    break;
  }
  return rc;
}